

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponseReliablePdu.cpp
# Opt level: O0

void __thiscall
DIS::ActionResponseReliablePdu::~ActionResponseReliablePdu(ActionResponseReliablePdu *this)

{
  ActionResponseReliablePdu *this_local;
  
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ActionResponseReliablePdu_002712d8;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::~vector
            (&this->_variableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::~vector(&this->_fixedDatumRecords)
  ;
  SimulationManagementWithReliabilityFamilyPdu::~SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  return;
}

Assistant:

ActionResponseReliablePdu::~ActionResponseReliablePdu()
{
    _fixedDatumRecords.clear();
    _variableDatumRecords.clear();
}